

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O0

istream * libDAI::operator>>(istream *is,FactorGraph *fg)

{
  long label;
  value_type vVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  void *pvVar7;
  reference pvVar8;
  reference pvVar9;
  pointer this;
  long *plVar10;
  difference_type dVar11;
  size_type *psVar12;
  size_t sVar13;
  size_type sVar14;
  istream *in_RDI;
  char *e;
  size_t sli;
  size_t k_4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> svi;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vi;
  double val;
  size_t li;
  size_t k_3;
  size_t nr_nonzeros;
  size_t k_2;
  size_t k_1;
  multind smi;
  multind mi;
  size_t k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sdims;
  iterator j_loc;
  long search_for;
  size_t mi_4;
  iterator j;
  vector<long,_std::allocator<long>_> sigma;
  size_t mi_3;
  VarSet I_vars;
  size_t mi_dim;
  size_t mi_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dims;
  long mi_label;
  size_t mi_1;
  vector<long,_std::allocator<long>_> labels;
  size_t nr_members;
  size_t I;
  string line;
  size_t nr_f;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> factors;
  long verbose;
  FactorGraph *in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  int in_stack_fffffffffffff904;
  allocator_type *in_stack_fffffffffffff908;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffff910;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffff918;
  TFactor<double> *in_stack_fffffffffffff920;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff928;
  multind *in_stack_fffffffffffff930;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *in_stack_fffffffffffff938;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  in_stack_fffffffffffff940;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  in_stack_fffffffffffff948;
  multind *in_stack_fffffffffffff950;
  string *in_stack_fffffffffffff970;
  multind *in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffffac8;
  FactorGraph *in_stack_fffffffffffffad0;
  ostream_iterator<libDAI::TFactor<double>,_char,_std::char_traits<char>_> local_458;
  TFactor<double> *local_448;
  TFactor<double> *local_440;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_428;
  unsigned_long *local_418;
  unsigned_long *local_410;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_3f8;
  unsigned_long *local_3e8;
  unsigned_long *local_3e0;
  size_t local_3c0;
  ulong local_3b8;
  undefined1 local_3a9 [9];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_388;
  VarSet *local_370;
  ulong local_368;
  ulong local_360;
  ulong local_358;
  size_type local_350;
  size_type local_348;
  size_type local_2b0;
  undefined8 local_2a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_298;
  ostream_iterator<int,_char,_std::char_traits<char>_> local_270;
  long *local_260;
  long *local_258;
  Var *local_250;
  long *local_248;
  long *local_240;
  long *local_238;
  long *local_230;
  long local_228;
  ulong local_220;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_218 [2];
  undefined8 local_208;
  vector<long,_std::allocator<long>_> local_200 [3];
  Var local_1b0;
  size_type local_1a0;
  ostream_iterator<int,_char,_std::char_traits<char>_> local_168;
  unsigned_long *local_158;
  unsigned_long *local_150;
  ulong local_148;
  ulong local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  ostream_iterator<int,_char,_std::char_traits<char>_> local_110;
  long *local_100;
  long *local_f8;
  long local_f0;
  ulong local_e8;
  vector<long,_std::allocator<long>_> local_e0;
  ulong local_c8;
  ulong local_c0;
  undefined1 local_b2;
  undefined1 local_8a;
  string local_58 [32];
  ulong local_38 [4];
  long local_18;
  istream *local_8;
  
  local_18 = 0;
  local_8 = in_RDI;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb3a530)
  ;
  std::__cxx11::string::string(local_58);
  while (iVar4 = std::istream::peek(), iVar4 == 0x23) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_58);
  }
  std::istream::operator>>(local_8,local_38);
  bVar3 = std::ios::fail();
  if ((bVar3 & 1) != 0) {
    local_8a = 1;
    uVar6 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff940._M_current,(char *)in_stack_fffffffffffff938,
               (allocator<char> *)in_stack_fffffffffffff930);
    Exception::Exception
              ((Exception *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
               (size_t)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    local_8a = 0;
    __cxa_throw(uVar6,&Exception::typeinfo,Exception::~Exception);
  }
  if (1 < local_18) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Reading ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_38[0]);
    poVar5 = std::operator<<(poVar5," factors...");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_58);
  bVar3 = std::ios::fail();
  if ((bVar3 & 1) != 0) {
    local_b2 = 1;
    uVar6 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff940._M_current,(char *)in_stack_fffffffffffff938,
               (allocator<char> *)in_stack_fffffffffffff930);
    Exception::Exception
              ((Exception *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
               (size_t)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
    local_b2 = 0;
    __cxa_throw(uVar6,&Exception::typeinfo,Exception::~Exception);
  }
  for (local_c0 = 0; local_c0 < local_38[0]; local_c0 = local_c0 + 1) {
    if (2 < local_18) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Reading factor ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_c0);
      poVar5 = std::operator<<(poVar5,"...");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    while (iVar4 = std::istream::peek(), iVar4 == 0x23) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_58);
    }
    std::istream::operator>>(local_8,&local_c8);
    if (2 < local_18) {
      poVar5 = std::operator<<((ostream *)&std::cout,"  nr_members: ");
      pvVar7 = (void *)std::ostream::operator<<(poVar5,local_c8);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    }
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)0xb3a9e1);
    for (local_e8 = 0; local_e8 < local_c8; local_e8 = local_e8 + 1) {
      while (iVar4 = std::istream::peek(), iVar4 == 0x23) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_58);
      }
      std::istream::operator>>(local_8,&local_f0);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff910._M_current,
                 (value_type_conflict5 *)in_stack_fffffffffffff908);
    }
    if (2 < local_18) {
      std::operator<<((ostream *)&std::cout,"  labels: ");
      local_f8 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                   ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff8f8
                                   );
      local_100 = (long *)std::vector<long,_std::allocator<long>_>::end
                                    ((vector<long,_std::allocator<long>_> *)
                                     in_stack_fffffffffffff8f8);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_110,(ostream_type *)&std::cout," ");
      std::
      copy<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                 in_stack_fffffffffffff948._M_current,
                 (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                 in_stack_fffffffffffff940._M_current,
                 (ostream_iterator<int,_char,_std::char_traits<char>_> *)in_stack_fffffffffffff938);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xb3ab60);
    for (local_140 = 0; local_140 < local_c8; local_140 = local_140 + 1) {
      while (iVar4 = std::istream::peek(), iVar4 == 0x23) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_58);
      }
      std::istream::operator>>(local_8,&local_148);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff910._M_current,
                 (value_type_conflict2 *)in_stack_fffffffffffff908);
    }
    if (2 < local_18) {
      std::operator<<((ostream *)&std::cout,"  dimensions: ");
      local_150 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffff8f8);
      local_158 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffff8f8);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_168,(ostream_type *)&std::cout," ");
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffff948._M_current,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffff940._M_current,
                 (ostream_iterator<int,_char,_std::char_traits<char>_> *)in_stack_fffffffffffff938);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    VarSet::VarSet((VarSet *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    for (local_1a0 = 0; local_1a0 < local_c8; local_1a0 = local_1a0 + 1) {
      pvVar8 = std::vector<long,_std::allocator<long>_>::operator[](&local_e0,local_1a0);
      label = *pvVar8;
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_138,local_1a0);
      Var::Var(&local_1b0,label,*pvVar9);
      VarSet::operator|=(&(in_stack_fffffffffffff940._M_current)->_vs,
                         (Var *)in_stack_fffffffffffff938);
    }
    TFactor<double>::TFactor
              (in_stack_fffffffffffff920,(VarSet *)in_stack_fffffffffffff918._M_current,
               (Real)in_stack_fffffffffffff910._M_current);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               (value_type *)in_stack_fffffffffffff8f8);
    TFactor<double>::~TFactor
              ((TFactor<double> *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    local_208 = 0;
    std::allocator<long>::allocator((allocator<long> *)0xb3ae0d);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff920,
               (size_type)in_stack_fffffffffffff918._M_current,in_stack_fffffffffffff910._M_current,
               in_stack_fffffffffffff908);
    std::allocator<long>::~allocator((allocator<long> *)0xb3ae41);
    local_218[0]._M_current = (Var *)VarSet::begin((VarSet *)in_stack_fffffffffffff8f8);
    local_220 = 0;
    while (local_220 < local_c8) {
      this = __gnu_cxx::
             __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator->(local_218);
      plVar10 = Var::label(this);
      local_228 = *plVar10;
      local_238 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                    ((vector<long,_std::allocator<long>_> *)
                                     in_stack_fffffffffffff8f8);
      local_240 = (long *)std::vector<long,_std::allocator<long>_>::end
                                    ((vector<long,_std::allocator<long>_> *)
                                     in_stack_fffffffffffff8f8);
      local_230 = (long *)std::
                          find<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                                    (in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                                     (long *)in_stack_fffffffffffff908);
      local_248 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                    ((vector<long,_std::allocator<long>_> *)
                                     in_stack_fffffffffffff8f8);
      dVar11 = __gnu_cxx::operator-
                         ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                          CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                          (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                          in_stack_fffffffffffff8f8);
      pvVar8 = std::vector<long,_std::allocator<long>_>::operator[](local_200,local_220);
      *pvVar8 = dVar11;
      local_220 = local_220 + 1;
      local_250 = (Var *)__gnu_cxx::
                         __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                         ::operator++((__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                                       *)in_stack_fffffffffffff908,in_stack_fffffffffffff904);
    }
    if (2 < local_18) {
      std::operator<<((ostream *)&std::cout,"  sigma: ");
      local_258 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                    ((vector<long,_std::allocator<long>_> *)
                                     in_stack_fffffffffffff8f8);
      local_260 = (long *)std::vector<long,_std::allocator<long>_>::end
                                    ((vector<long,_std::allocator<long>_> *)
                                     in_stack_fffffffffffff8f8);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_270,(ostream_type *)&std::cout," ");
      std::
      copy<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                 in_stack_fffffffffffff948._M_current,
                 (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                 in_stack_fffffffffffff940._M_current,
                 (ostream_iterator<int,_char,_std::char_traits<char>_> *)in_stack_fffffffffffff938);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    local_2a0 = 0;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb3b0ee);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff920,
               (size_type)in_stack_fffffffffffff918._M_current,
               (value_type_conflict2 *)in_stack_fffffffffffff910._M_current,
               (allocator_type *)in_stack_fffffffffffff908);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb3b122);
    for (local_2b0 = 0; local_2b0 < local_c8; local_2b0 = local_2b0 + 1) {
      psVar12 = (size_type *)
                std::vector<long,_std::allocator<long>_>::operator[](local_200,local_2b0);
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_138,*psVar12);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_298,local_2b0);
      *pvVar9 = vVar1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&in_stack_fffffffffffff950->_dims,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff948._M_current);
    multind::multind(in_stack_fffffffffffff950,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff948._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff910._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&in_stack_fffffffffffff950->_dims,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff948._M_current);
    multind::multind(in_stack_fffffffffffff950,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff948._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff910._M_current);
    if (2 < local_18) {
      poVar5 = std::operator<<((ostream *)&std::cout,"  mi.max(): ");
      sVar13 = multind::max((multind *)0xb3b27f);
      pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar13);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"       ");
      for (local_348 = 0; local_348 < local_c8; local_348 = local_348 + 1) {
        pvVar8 = std::vector<long,_std::allocator<long>_>::operator[](&local_e0,local_348);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar8);
        std::operator<<(poVar5," ");
      }
      std::operator<<((ostream *)&std::cout,"   ");
      for (local_350 = 0; local_350 < local_c8; local_350 = local_350 + 1) {
        psVar12 = (size_type *)
                  std::vector<long,_std::allocator<long>_>::operator[](local_200,local_350);
        pvVar8 = std::vector<long,_std::allocator<long>_>::operator[](&local_e0,*psVar12);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar8);
        std::operator<<(poVar5," ");
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    while (iVar4 = std::istream::peek(), iVar4 == 0x23) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_58);
    }
    std::istream::operator>>(local_8,&local_358);
    if (2 < local_18) {
      poVar5 = std::operator<<((ostream *)&std::cout,"  nonzeroes: ");
      pvVar7 = (void *)std::ostream::operator<<(poVar5,local_358);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    }
    for (local_360 = 0; local_360 < local_358; local_360 = local_360 + 1) {
      while (iVar4 = std::istream::peek(), iVar4 == 0x23) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_58);
      }
      std::istream::operator>>(local_8,&local_368);
      while (iVar4 = std::istream::peek(), iVar4 == 0x23) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_58);
      }
      std::istream::operator>>(local_8,(double *)&local_370);
      multind::vi(in_stack_fffffffffffff978,(size_t)in_stack_fffffffffffff970);
      in_stack_fffffffffffff970 =
           (string *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_388);
      local_3a9._1_8_ = 0;
      in_stack_fffffffffffff978 = (multind *)local_3a9;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb3b66d);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff920,
                 (size_type)in_stack_fffffffffffff918._M_current,
                 (value_type_conflict2 *)in_stack_fffffffffffff910._M_current,
                 (allocator_type *)in_stack_fffffffffffff908);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb3b69e);
      for (local_3b8 = 0; uVar2 = local_3b8,
          sVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_388),
          uVar2 < sVar14; local_3b8 = local_3b8 + 1) {
        psVar12 = (size_type *)
                  std::vector<long,_std::allocator<long>_>::operator[](local_200,local_3b8);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_388,*psVar12);
        vVar1 = *pvVar9;
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_3a0,local_3b8);
        *pvVar9 = vVar1;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&in_stack_fffffffffffff950->_dims,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff948._M_current);
      sVar13 = multind::li(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff910._M_current);
      local_3c0 = sVar13;
      if (2 < local_18) {
        in_stack_fffffffffffff950 = (multind *)std::operator<<((ostream *)&std::cout,"    ");
        in_stack_fffffffffffff948._M_current =
             (TFactor<double> *)std::ostream::operator<<(in_stack_fffffffffffff950,local_368);
        std::operator<<((ostream *)in_stack_fffffffffffff948._M_current,": ");
        in_stack_fffffffffffff940._M_current = (TFactor<double> *)&local_388;
        local_3e0 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff8f8);
        local_3e8 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff8f8);
        std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::ostream_iterator
                  (&local_3f8,(ostream_type *)&std::cout," ");
        std::
        copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff948._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff940._M_current,in_stack_fffffffffffff938);
        std::operator<<((ostream *)&std::cout,"-> ");
        in_stack_fffffffffffff938 =
             (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)&local_3a0;
        local_410 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff8f8);
        local_418 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff8f8);
        std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::ostream_iterator
                  (&local_428,(ostream_type *)&std::cout," ");
        std::
        copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff948._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff940._M_current,in_stack_fffffffffffff938);
        in_stack_fffffffffffff930 = (multind *)std::operator<<((ostream *)&std::cout,": ");
        in_stack_fffffffffffff928 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::ostream::operator<<(in_stack_fffffffffffff930,local_3c0);
        std::ostream::operator<<(in_stack_fffffffffffff928,std::endl<char,std::char_traits<char>>);
      }
      in_stack_fffffffffffff918._M_current = (long *)local_370;
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::back
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
      in_stack_fffffffffffff920 =
           (TFactor<double> *)
           TFactor<double>::operator[]
                     ((TFactor<double> *)
                      CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                      (size_t)in_stack_fffffffffffff8f8);
      (in_stack_fffffffffffff920->_vs)._vars.
      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffff918._M_current;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff910._M_current);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff910._M_current);
    }
    multind::~multind((multind *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    multind::~multind((multind *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff910._M_current);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff910._M_current);
    VarSet::~VarSet((VarSet *)0xb3ba4b);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff910._M_current);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff910._M_current);
  }
  if (2 < local_18) {
    in_stack_fffffffffffff910._M_current = (long *)std::operator<<((ostream *)&std::cout,"factors:")
    ;
    std::ostream::operator<<
              (in_stack_fffffffffffff910._M_current,std::endl<char,std::char_traits<char>>);
    local_440 = (TFactor<double> *)
                std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
                begin((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                      in_stack_fffffffffffff8f8);
    local_448 = (TFactor<double> *)
                std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                          ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                            *)in_stack_fffffffffffff8f8);
    std::ostream_iterator<libDAI::TFactor<double>,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_458,(ostream_type *)&std::cout,"\n");
    std::
    copy<__gnu_cxx::__normal_iterator<libDAI::TFactor<double>*,std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>>,std::ostream_iterator<libDAI::TFactor<double>,char,std::char_traits<char>>>
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940,
               (ostream_iterator<libDAI::TFactor<double>,_char,_std::char_traits<char>_> *)
               in_stack_fffffffffffff938);
  }
  FactorGraph::FactorGraph(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  FactorGraph::operator=
            ((FactorGraph *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
             in_stack_fffffffffffff8f8);
  FactorGraph::~FactorGraph
            ((FactorGraph *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  std::__cxx11::string::~string(local_58);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffff910._M_current);
  return local_8;
}

Assistant:

std::istream& operator >> (std::istream& is, FactorGraph& fg) {
        long verbose = 0;

        try {
            vector<Factor> factors;
            size_t nr_f;
            string line;
            
            while( (is.peek()) == '#' )
                getline(is,line);
            is >> nr_f;
            if( is.fail() )
                DAI_THROW(INVALID_FACTORGRAPH_FILE);
            if( verbose >= 2 )
                cout << "Reading " << nr_f << " factors..." << endl;

            getline (is,line);
            if( is.fail() )
                DAI_THROW(INVALID_FACTORGRAPH_FILE);

            for( size_t I = 0; I < nr_f; I++ ) {
                if( verbose >= 3 )
                    cout << "Reading factor " << I << "..." << endl;
                size_t nr_members;
                while( (is.peek()) == '#' )
                    getline(is,line);
                is >> nr_members;
                if( verbose >= 3 )
                    cout << "  nr_members: " << nr_members << endl;

                vector<long> labels;
                for( size_t mi = 0; mi < nr_members; mi++ ) {
                    long mi_label;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> mi_label;
                    labels.push_back(mi_label);
                }
                if( verbose >= 3 ) {
                    cout << "  labels: ";
                    copy (labels.begin(), labels.end(), ostream_iterator<int>(cout, " "));
                    cout << endl;
                }

                vector<size_t> dims;
                for( size_t mi = 0; mi < nr_members; mi++ ) {
                    size_t mi_dim;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> mi_dim;
                    dims.push_back(mi_dim);
                }
                if( verbose >= 3 ) {
                    cout << "  dimensions: ";
                    copy (dims.begin(), dims.end(), ostream_iterator<int>(cout, " "));
                    cout << endl;
                }

                // add the Factor
                VarSet I_vars;
                for( size_t mi = 0; mi < nr_members; mi++ )
                    I_vars |= Var(labels[mi], dims[mi]);
                factors.push_back(Factor(I_vars,0.0));
                
                // calculate permutation sigma (internally, members are sorted)
                vector<long> sigma(nr_members,0);
                VarSet::iterator j = I_vars.begin();
                for( size_t mi = 0; mi < nr_members; mi++,j++ ) {
                    long search_for = j->label();
                    vector<long>::iterator j_loc = find(labels.begin(),labels.end(),search_for);
                    sigma[mi] = j_loc - labels.begin();
                }
                if( verbose >= 3 ) {
                    cout << "  sigma: ";
                    copy( sigma.begin(), sigma.end(), ostream_iterator<int>(cout," "));
                    cout << endl;
                }

                // calculate multindices
                vector<size_t> sdims(nr_members,0);
                for( size_t k = 0; k < nr_members; k++ ) {
                    sdims[k] = dims[sigma[k]];
                }
                multind mi(dims);
                multind smi(sdims);
                if( verbose >= 3 ) {
                    cout << "  mi.max(): " << mi.max() << endl;
                    cout << "       ";
                    for( size_t k=0; k < nr_members; k++ ) 
                        cout << labels[k] << " ";
                    cout << "   ";
                    for( size_t k=0; k < nr_members; k++ ) 
                        cout << labels[sigma[k]] << " ";
                    cout << endl;
                }
                
                // read values
                size_t nr_nonzeros;
                while( (is.peek()) == '#' )
                    getline(is,line);
                is >> nr_nonzeros;
                if( verbose >= 3 ) 
                    cout << "  nonzeroes: " << nr_nonzeros << endl;
                for( size_t k = 0; k < nr_nonzeros; k++ ) {
                    size_t li;
                    double val;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> li;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> val;

                    vector<size_t> vi = mi.vi(li);
                    vector<size_t> svi(vi.size(),0);
                    for( size_t k = 0; k < vi.size(); k++ )
                        svi[k] = vi[sigma[k]];
                    size_t sli = smi.li(svi);
                    if( verbose >= 3 ) {
                        cout << "    " << li << ": ";
                        copy( vi.begin(), vi.end(), ostream_iterator<size_t>(cout," "));
                        cout << "-> ";
                        copy( svi.begin(), svi.end(), ostream_iterator<size_t>(cout," "));
                        cout << ": " << sli << endl;
                    }
                    factors.back()[sli] = val;
                }
            }

            if( verbose >= 3 ) {
                cout << "factors:" << endl;
                copy(factors.begin(), factors.end(), ostream_iterator<Factor>(cout,"\n"));
            }

            fg = FactorGraph(factors);
        } catch (char *e) {
            cout << e << endl;
        }

        return is;
    }